

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void bill_box_content(obj *obj,boolean dummy)

{
  obj *local_20;
  obj *otmp;
  boolean dummy_local;
  obj *obj_local;
  
  for (local_20 = obj->cobj; local_20 != (obj *)0x0; local_20 = local_20->nobj) {
    if (local_20->oclass != '\f') {
      if ((*(uint *)&local_20->field_0x4a >> 3 & 1) == 0) {
        add_one_tobill(local_20,dummy);
      }
      if (local_20->cobj != (obj *)0x0) {
        bill_box_content(local_20,dummy);
      }
    }
  }
  return;
}

Assistant:

void bill_box_content(struct obj *obj, boolean dummy)
{
	struct obj *otmp;

	for (otmp = obj->cobj; otmp; otmp = otmp->nobj) {
		if (otmp->oclass == COIN_CLASS) continue;

		/* the "top" box is added in addtobill() */
		if (!otmp->no_charge)
		    add_one_tobill(otmp, dummy);
		if (Has_contents(otmp))
		    bill_box_content(otmp, dummy);
	}

}